

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O0

Expression *
slang::ast::NewArrayExpression::fromSyntax
          (Compilation *compilation,NewArrayExpressionSyntax *syntax,ASTContext *context,
          Type *assignmentTarget)

{
  SourceRange sourceRange;
  SourceRange assignmentRange;
  bool bVar1;
  Type *pTVar2;
  BumpAllocator *this;
  NewArrayExpression *pNVar3;
  Compilation *in_RCX;
  Type *in_RDX;
  bitmask<slang::ast::ASTFlags> in_RSI;
  SourceLocation in_RDI;
  NewArrayExpression *result;
  Expression *initExpr;
  Expression *sizeExpr;
  SourceLocation expr;
  Type *in_stack_ffffffffffffff30;
  Compilation *compilation_00;
  ASTContext *in_stack_ffffffffffffff38;
  Compilation *in_stack_ffffffffffffff40;
  Compilation *in_stack_ffffffffffffff48;
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffff50;
  SourceLocation in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff60;
  DiagCode code;
  SyntaxNode *local_88;
  bitmask<slang::ast::ASTFlags> local_70 [3];
  Expression *local_58;
  bitmask<slang::ast::ASTFlags> local_50;
  Expression *local_48;
  SourceRange local_40;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  SourceLocation in_stack_fffffffffffffff8;
  
  code = SUB84((ulong)in_stack_ffffffffffffff60 >> 0x20,0);
  if ((in_RCX == (Compilation *)0x0) ||
     (pTVar2 = Type::getCanonicalType(in_stack_ffffffffffffff30),
     (pTVar2->super_Symbol).kind != DynamicArrayType)) {
    if ((in_RCX == (Compilation *)0x0) || (bVar1 = Type::isError((Type *)0x7e4f60), !bVar1)) {
      in_stack_ffffffffffffffd4 = 0x7a0007;
      local_40 = slang::syntax::SyntaxNode::sourceRange(local_88);
      sourceRange.endLoc = in_stack_ffffffffffffff58;
      sourceRange.startLoc = (SourceLocation)in_stack_ffffffffffffff50.m_bits;
      ASTContext::addDiag((ASTContext *)in_stack_ffffffffffffff48,code,sourceRange);
    }
    if (in_RCX == (Compilation *)0x0) {
      in_RCX = (Compilation *)Compilation::getErrorType((Compilation *)in_RDI);
    }
  }
  expr = in_RDI;
  this = (BumpAllocator *)
         not_null<slang::syntax::ExpressionSyntax_*>::operator*
                   ((not_null<slang::syntax::ExpressionSyntax_*> *)0x7e4ffc);
  bitmask<slang::ast::ASTFlags>::bitmask(&local_50,None);
  local_48 = Expression::selfDetermined
                       (in_stack_ffffffffffffff48,(ExpressionSyntax *)in_stack_ffffffffffffff40,
                        in_stack_ffffffffffffff38,in_stack_ffffffffffffff50);
  local_58 = (Expression *)0x0;
  compilation_00 = in_RCX;
  if (*(long *)(in_RSI.m_bits + 0x48) != 0) {
    in_stack_ffffffffffffff48 =
         (Compilation *)
         not_null<slang::syntax::ExpressionSyntax_*>::operator*
                   ((not_null<slang::syntax::ExpressionSyntax_*> *)0x7e5080);
    in_stack_ffffffffffffff50.m_bits = (underlying_type)in_RDX;
    SourceRange::SourceRange((SourceRange *)in_stack_ffffffffffffff30);
    pTVar2 = (Type *)in_stack_ffffffffffffff50.m_bits;
    bitmask<slang::ast::ASTFlags>::bitmask(local_70,None);
    assignmentRange.endLoc = in_stack_fffffffffffffff8;
    assignmentRange.startLoc = expr;
    local_58 = Expression::bindRValue
                         (pTVar2,(ExpressionSyntax *)compilation_00,assignmentRange,
                          (ASTContext *)
                          CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),in_RSI);
    in_stack_ffffffffffffff40 = in_RCX;
  }
  slang::syntax::SyntaxNode::sourceRange(local_88);
  pNVar3 = BumpAllocator::
           emplace<slang::ast::NewArrayExpression,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::Expression_const*&,slang::SourceRange>
                     (this,(Type *)in_RDI,(Expression *)in_stack_ffffffffffffff50.m_bits,
                      (Expression **)in_stack_ffffffffffffff48,
                      (SourceRange *)in_stack_ffffffffffffff40);
  bVar1 = Expression::bad((Expression *)compilation_00);
  if ((bVar1) ||
     ((local_58 != (Expression *)0x0 &&
      (bVar1 = Expression::bad((Expression *)compilation_00), bVar1)))) {
    pNVar3 = (NewArrayExpression *)Expression::badExpr(compilation_00,(Expression *)expr);
  }
  else {
    bVar1 = ASTContext::requireIntegral
                      ((ASTContext *)in_RDI,(Expression *)in_stack_ffffffffffffff50.m_bits);
    if (!bVar1) {
      pNVar3 = (NewArrayExpression *)Expression::badExpr(compilation_00,(Expression *)expr);
    }
  }
  return &pNVar3->super_Expression;
}

Assistant:

Expression& NewArrayExpression::fromSyntax(Compilation& compilation,
                                           const NewArrayExpressionSyntax& syntax,
                                           const ASTContext& context,
                                           const Type* assignmentTarget) {
    if (!assignmentTarget ||
        assignmentTarget->getCanonicalType().kind != SymbolKind::DynamicArrayType) {

        if (!assignmentTarget || !assignmentTarget->isError())
            context.addDiag(diag::NewArrayTarget, syntax.sourceRange());

        if (!assignmentTarget)
            assignmentTarget = &compilation.getErrorType();
    }

    auto& sizeExpr = selfDetermined(compilation, *syntax.sizeExpr, context);
    const Expression* initExpr = nullptr;
    if (syntax.initializer)
        initExpr = &bindRValue(*assignmentTarget, *syntax.initializer->expression, {}, context);

    auto result = compilation.emplace<NewArrayExpression>(*assignmentTarget, sizeExpr, initExpr,
                                                          syntax.sourceRange());
    if (sizeExpr.bad() || (initExpr && initExpr->bad()))
        return badExpr(compilation, result);

    if (!context.requireIntegral(sizeExpr))
        return badExpr(compilation, result);

    return *result;
}